

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderAdjacencyTests.cpp
# Opt level: O0

void __thiscall
glcts::GeometryShaderAdjacencyTests::createGridTriangles
          (GeometryShaderAdjacencyTests *this,AdjacencyTestData *test_data)

{
  undefined1 auVar1 [16];
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  AdjacencyGridTriangle *pAVar5;
  AdjacencyGridPoint *pAVar6;
  AdjacencyGridPoint *pAVar7;
  AdjacencyGridPoint *pAVar8;
  AdjacencyGridPoint *pAVar9;
  uint uVar10;
  AdjacencyGridPoint *pointBR;
  AdjacencyGridPoint *pointBL;
  AdjacencyGridPoint *pointTR;
  AdjacencyGridPoint *pointTL;
  uint quadTLY;
  uint quadTLX;
  uint nQuad;
  uint nTriangles;
  int nTrianglesPerQuad;
  AdjacencyTestData *test_data_local;
  GeometryShaderAdjacencyTests *this_local;
  
  uVar2 = this->m_grid_granulity * this->m_grid_granulity;
  uVar3 = uVar2 * 2;
  auVar1 = ZEXT416(uVar3) * ZEXT816(0x30);
  uVar4 = auVar1._0_8_;
  if (auVar1._8_8_ != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  pAVar5 = (AdjacencyGridTriangle *)operator_new__(uVar4);
  test_data->m_grid->m_triangles = pAVar5;
  test_data->m_grid->m_n_triangles = uVar3;
  for (quadTLY = 0; quadTLY < (uVar2 & 0x7fffffff); quadTLY = quadTLY + 1) {
    uVar10 = quadTLY % this->m_grid_granulity;
    uVar3 = quadTLY / this->m_grid_granulity;
    pAVar6 = test_data->m_grid->m_points + (uVar3 * (this->m_grid_granulity + 1) + uVar10);
    pAVar7 = test_data->m_grid->m_points + (uVar3 * (this->m_grid_granulity + 1) + uVar10 + 1);
    pAVar8 = test_data->m_grid->m_points + ((uVar3 + 1) * (this->m_grid_granulity + 1) + uVar10);
    pAVar9 = test_data->m_grid->m_points + ((uVar3 + 1) * (this->m_grid_granulity + 1) + uVar10 + 1)
    ;
    test_data->m_grid->m_triangles[quadTLY << 1].m_vertex_x = pAVar6;
    test_data->m_grid->m_triangles[quadTLY << 1].m_vertex_x_adjacent = pAVar7;
    test_data->m_grid->m_triangles[quadTLY << 1].m_vertex_y = pAVar9;
    test_data->m_grid->m_triangles[quadTLY << 1].m_vertex_y_adjacent = pAVar8;
    test_data->m_grid->m_triangles[quadTLY << 1].m_vertex_z = pAVar8;
    test_data->m_grid->m_triangles[quadTLY << 1].m_vertex_z_adjacent = pAVar9;
    test_data->m_grid->m_triangles[quadTLY * 2 + 1].m_vertex_x = pAVar6;
    test_data->m_grid->m_triangles[quadTLY * 2 + 1].m_vertex_x_adjacent = pAVar7;
    test_data->m_grid->m_triangles[quadTLY * 2 + 1].m_vertex_y = pAVar7;
    test_data->m_grid->m_triangles[quadTLY * 2 + 1].m_vertex_y_adjacent = pAVar6;
    test_data->m_grid->m_triangles[quadTLY * 2 + 1].m_vertex_z = pAVar9;
    test_data->m_grid->m_triangles[quadTLY * 2 + 1].m_vertex_z_adjacent = pAVar8;
  }
  return;
}

Assistant:

void GeometryShaderAdjacencyTests::createGridTriangles(AdjacencyTestData& test_data)
{
	const int	nTrianglesPerQuad = 2;
	unsigned int nTriangles		   = m_grid_granulity * m_grid_granulity * nTrianglesPerQuad;

	test_data.m_grid->m_triangles   = new AdjacencyGridTriangle[nTriangles];
	test_data.m_grid->m_n_triangles = nTriangles;

	for (unsigned int nQuad = 0; nQuad < (nTriangles / nTrianglesPerQuad); ++nQuad)
	{
		unsigned int quadTLX = (nQuad) % m_grid_granulity;
		unsigned int quadTLY = (nQuad) / m_grid_granulity;

		/* Grid is built off points row-by-row. */
		AdjacencyGridPoint* pointTL = test_data.m_grid->m_points + (quadTLY * (m_grid_granulity + 1) + quadTLX);
		AdjacencyGridPoint* pointTR = test_data.m_grid->m_points + (quadTLY * (m_grid_granulity + 1) + quadTLX + 1);
		AdjacencyGridPoint* pointBL = test_data.m_grid->m_points + ((quadTLY + 1) * (m_grid_granulity + 1) + quadTLX);
		AdjacencyGridPoint* pointBR =
			test_data.m_grid->m_points + ((quadTLY + 1) * (m_grid_granulity + 1) + quadTLX + 1);

		/* Note: In many cases, the adjacency data used below is not correct topologically-wise.
		 *       However, since we're not doing any rendering, we're safe as long as unique data
		 *       is used.
		 */
		test_data.m_grid->m_triangles[nQuad * nTrianglesPerQuad + 0].m_vertex_x			 = pointTL;
		test_data.m_grid->m_triangles[nQuad * nTrianglesPerQuad + 0].m_vertex_x_adjacent = pointTR;
		test_data.m_grid->m_triangles[nQuad * nTrianglesPerQuad + 0].m_vertex_y			 = pointBR;
		test_data.m_grid->m_triangles[nQuad * nTrianglesPerQuad + 0].m_vertex_y_adjacent = pointBL;
		test_data.m_grid->m_triangles[nQuad * nTrianglesPerQuad + 0].m_vertex_z			 = pointBL;
		test_data.m_grid->m_triangles[nQuad * nTrianglesPerQuad + 0].m_vertex_z_adjacent = pointBR;

		test_data.m_grid->m_triangles[nQuad * nTrianglesPerQuad + 1].m_vertex_x			 = pointTL;
		test_data.m_grid->m_triangles[nQuad * nTrianglesPerQuad + 1].m_vertex_x_adjacent = pointTR;
		test_data.m_grid->m_triangles[nQuad * nTrianglesPerQuad + 1].m_vertex_y			 = pointTR;
		test_data.m_grid->m_triangles[nQuad * nTrianglesPerQuad + 1].m_vertex_y_adjacent = pointTL;
		test_data.m_grid->m_triangles[nQuad * nTrianglesPerQuad + 1].m_vertex_z			 = pointBR;
		test_data.m_grid->m_triangles[nQuad * nTrianglesPerQuad + 1].m_vertex_z_adjacent = pointBL;
	}
}